

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

ogt_vox_transform *
ogt_vox_sample_group_transform_global
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_group *group,uint32_t frame_index,
          ogt_vox_scene *scene)

{
  ogt_vox_group *poVar1;
  ulong uVar2;
  ogt_vox_transform local_a4;
  undefined1 local_64 [8];
  ogt_vox_transform group_transform;
  uint32_t group_index;
  ogt_vox_scene *scene_local;
  uint32_t frame_index_local;
  ogt_vox_group *group_local;
  
  unique0x10000099 = scene;
  ogt_vox_sample_group_transform_local(__return_storage_ptr__,group,frame_index);
  group_transform.m32 = (float)group->parent_group_index;
  while (group_transform.m32 != -NAN) {
    poVar1 = stack0xffffffffffffffe0->groups;
    uVar2 = (ulong)(uint)group_transform.m32;
    ogt_vox_sample_group_transform_local((ogt_vox_transform *)local_64,poVar1 + uVar2,frame_index);
    ogt_vox_transform_multiply(&local_a4,__return_storage_ptr__,(ogt_vox_transform *)local_64);
    memcpy(__return_storage_ptr__,&local_a4,0x40);
    group_transform.m32 = (float)poVar1[uVar2].parent_group_index;
  }
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_sample_group_transform_global(const ogt_vox_group* group, uint32_t frame_index, const ogt_vox_scene* scene)
    {
        ogt_vox_transform flattened_transform = ogt_vox_sample_group_transform_local(group, frame_index);
        uint32_t group_index = group->parent_group_index;
        while (group_index != k_invalid_group_index) {
            group = &scene->groups[group_index];
            ogt_vox_transform group_transform = ogt_vox_sample_group_transform_local(group, frame_index);
            flattened_transform = ogt_vox_transform_multiply(flattened_transform, group_transform);
            group_index = group->parent_group_index;
        }
        return flattened_transform;
    }